

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O1

ssize_t __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
          (intrusive_list<(anonymous_namespace)::TestObject> *this,int __fdin,__off64_t *__offin,
          int __fdout,__off64_t *__offout,size_t __len,uint __flags)

{
  long lVar1;
  long *plVar2;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  intrusive_list<(anonymous_namespace)::TestObject> *extraout_RAX;
  undefined4 in_register_0000000c;
  long *plVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  iterator iVar6;
  __uniq_ptr_impl<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_10;
  
  iVar6.list_._4_4_ = in_register_00000034;
  iVar6.list_._0_4_ = __fdin;
  plVar4 = (long *)CONCAT44(in_register_0000000c,__fdout);
  lVar1 = plVar4[2];
  if (lVar1 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x223,
                  "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                 );
  }
  if (__offout == plVar4) {
    if (__len != 0) {
      if (*plVar4 == plVar4[1]) {
        *plVar4 = 0;
        plVar4[1] = 0;
      }
      else {
        plVar2 = *(long **)(__len + 8);
        plVar5 = plVar2;
        if (plVar2 == (long *)0x0) {
          plVar5 = plVar4;
        }
        *plVar5 = *(long *)__len;
        if (*(long *)__len == 0) {
          plVar4[1] = (long)plVar2;
        }
        else {
          *(long **)(*(long *)__len + 8) = plVar2;
        }
      }
      *(undefined8 *)__len = 0;
      *(undefined8 *)(__len + 8) = 0;
      plVar4[2] = lVar1 + -1;
      iVar6.node_ = (TestObject *)__offin;
      local_10._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
      .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl =
           (tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
            )(tuple<(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
              )__len;
      iVar6 = insert(this,iVar6,
                     (unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
                      *)&local_10);
      piVar3 = iVar6.list_;
      if ((_Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
           )local_10._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
            .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>._M_head_impl !=
          (TestObject *)0x0) {
        if (*(char *)((long)local_10._M_t.
                            super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
                            .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>.
                            _M_head_impl + 0x18) == '\0') {
          ::(anonymous_namespace)::TestObject::creation_count =
               ::(anonymous_namespace)::TestObject::creation_count + -1;
        }
        operator_delete((void *)local_10._M_t.
                                super__Tuple_impl<0UL,_(anonymous_namespace)::TestObject_*,_std::default_delete<(anonymous_namespace)::TestObject>_>
                                .super__Head_base<0UL,_(anonymous_namespace)::TestObject_*,_false>.
                                _M_head_impl);
        piVar3 = extraout_RAX;
      }
      return (ssize_t)piVar3;
    }
    __assert_fail("pos != end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x224,
                  "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                 );
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0xc1,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator!=(iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}